

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkItem.cxx
# Opt level: O1

bool operator<(cmLinkItem *l,cmLinkItem *r)

{
  cmGeneratorTarget *pcVar1;
  cmGeneratorTarget *pcVar2;
  size_t __n;
  int iVar3;
  byte extraout_var;
  
  pcVar1 = l->Target;
  if (pcVar1 != (cmGeneratorTarget *)0x0) {
    pcVar2 = r->Target;
    if (pcVar2 != (cmGeneratorTarget *)0x0) {
      if (pcVar1 != pcVar2) {
        return pcVar1 < pcVar2;
      }
      goto LAB_0043ec24;
    }
    if (pcVar1 != (cmGeneratorTarget *)0x0) {
      return true;
    }
  }
  if (r->Target != (cmGeneratorTarget *)0x0) {
    return false;
  }
  __n = (l->String)._M_string_length;
  if ((__n != (r->String)._M_string_length) ||
     ((__n != 0 &&
      (iVar3 = bcmp((l->String)._M_dataplus._M_p,(r->String)._M_dataplus._M_p,__n), iVar3 != 0)))) {
    std::__cxx11::string::compare((string *)l);
    return (bool)(extraout_var >> 7);
  }
LAB_0043ec24:
  return l->Cross < r->Cross;
}

Assistant:

bool operator<(cmLinkItem const& l, cmLinkItem const& r)
{
  // Order among targets.
  if (l.Target && r.Target) {
    if (l.Target != r.Target) {
      return l.Target < r.Target;
    }
    // Order identical targets via cross-config.
    return l.Cross < r.Cross;
  }
  // Order targets before strings.
  if (l.Target) {
    return true;
  }
  if (r.Target) {
    return false;
  }
  // Order among strings.
  if (l.String != r.String) {
    return l.String < r.String;
  }
  // Order identical strings via cross-config.
  return l.Cross < r.Cross;
}